

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

QByteArray *
QUtf16::convertFromUnicode
          (QByteArray *__return_storage_ptr__,QStringView in,State *state,DataEndianness endian)

{
  Data *pDVar1;
  byte bVar2;
  char *out;
  long size;
  DataEndianness in_R9D;
  QStringView in_00;
  
  in_00.m_size = in.m_data;
  out = (char *)in.m_size;
  if ((state->internalState & 1) == 0) {
    bVar2 = ((byte)(state->flags).super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                   super_QFlagsStorage<QStringConverterBase::Flag>.i & 4) >> 2;
  }
  else {
    bVar2 = 0;
  }
  size = (long)out * 2 + 2;
  if (bVar2 == 0) {
    size = (long)out * 2;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  in_00.m_data = (storage_type_conflict *)state;
  convertFromUnicode((QUtf16 *)(__return_storage_ptr__->d).ptr,out,in_00,(State *)(ulong)endian,
                     in_R9D);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QUtf16::convertFromUnicode(QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;
    qsizetype length = 2 * in.size();
    if (writeBom)
        length += 2;

    QByteArray d(length, Qt::Uninitialized);
    char *end = convertFromUnicode(d.data(), in, state, endian);
    Q_ASSERT(end - d.constData() == d.size());
    Q_UNUSED(end);
    return d;
}